

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSONValue * __thiscall JSON::JSONValue::operator=(JSONValue *this,JSONValue *v)

{
  JSONValueType JVar1;
  string *s;
  longlong *plVar2;
  JSONArray *r;
  JSONObject *o;
  bool *b;
  double d;
  JSONValue *v_local;
  JSONValue *this_local;
  
  JVar1 = getType(v);
  switch(JVar1) {
  case STRING:
    s = getStringValue_abi_cxx11_(v);
    setStringValue(this,s);
    break;
  case INTEGER:
    plVar2 = getIntValue(v);
    setIntValue(this,*plVar2);
    break;
  case DOUBLE:
    d = getDoubleValue(v);
    setDoubleValue(this,d);
    break;
  case ARRAY:
    r = getArrayValue(v);
    setArrayValue(this,r);
    break;
  case OBJECT:
    o = getObjectValue(v);
    setObjectValue(this,o);
    break;
  case BOOLEAN:
    b = getBoolValue(v);
    setBoolValue(this,b);
    break;
  case JSONNULL:
    setNull(this);
  }
  return this;
}

Assistant:

JSONValue &JSONValue::operator=(const JSONValue &v) {
	switch(v.getType()) {
		case STRING:
			setStringValue(v.getStringValue());
			break;
		case INTEGER:
			setIntValue(v.getIntValue());
			break;
		case DOUBLE:
			setDoubleValue(v.getDoubleValue());
			break;
		case ARRAY:
			setArrayValue(v.getArrayValue());
			break;
		case OBJECT:
			setObjectValue(v.getObjectValue());
			break;
		case BOOLEAN:
			setBoolValue(v.getBoolValue());
			break;
		case JSONNULL:
			setNull();
			break;
	}
	return *this;
}